

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

bool __thiscall args::Matcher::Match(Matcher *this,EitherFlag *flag)

{
  bool local_21;
  EitherFlag *flag_local;
  Matcher *this_local;
  
  if ((flag->isShort & 1U) == 0) {
    local_21 = Match(this,&flag->longFlag);
  }
  else {
    local_21 = Match(this,flag->shortFlag);
  }
  return local_21;
}

Assistant:

bool Match(const EitherFlag &flag) const
            {
                return flag.isShort ? Match(flag.shortFlag) : Match(flag.longFlag);
            }